

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_108fc24::HandleFilterCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  cmList *this_00;
  long lVar5;
  FilterMode mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *var;
  string_view pattern;
  string_view value;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  optional<cmList> list;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar4 = lVar5 >> 5;
  if (uVar4 < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&list,"sub-command FILTER requires a list to be specified.",
               (allocator<char> *)&local_70);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (lVar5 == 0x40) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&list,"sub-command FILTER requires an operator to be specified.",
               (allocator<char> *)&local_70);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (3 < uVar4) {
      pbVar6 = pbVar1 + 2;
      bVar2 = std::operator==(pbVar6,"INCLUDE");
      mode = INCLUDE;
      if (!bVar2) {
        bVar2 = std::operator==(pbVar6,"EXCLUDE");
        if (!bVar2) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list,
                         "sub-command FILTER does not recognize operator ",pbVar6);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_0037a5e6;
        }
        mode = EXCLUDE;
      }
      var = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
      GetList(&list,var,status->Makefile);
      bVar2 = true;
      if (list.super__Optional_base<cmList,_false,_false>._M_payload.
          super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
          _M_engaged == true) {
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3;
        bVar3 = std::operator!=(pbVar6,"REGEX");
        if (bVar3) {
          std::operator+(&local_70,"sub-command FILTER does not recognize mode ",pbVar6);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
            this = status->Makefile;
            pattern._M_str = pbVar1[4]._M_dataplus._M_p;
            pattern._M_len = pbVar1[4]._M_string_length;
            this_00 = cmList::filter((cmList *)&list,pattern,mode);
            cmList::to_string_abi_cxx11_(&local_70,this_00);
            value._M_str = local_70._M_dataplus._M_p;
            value._M_len = local_70._M_string_length;
            cmMakefile::AddDefinition(this,var,value);
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_0037a695;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"sub-command FILTER, mode REGEX requires five arguments.",
                     &local_71);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        std::__cxx11::string::~string((string *)&local_70);
        bVar2 = false;
      }
LAB_0037a695:
      std::_Optional_payload_base<cmList>::_M_reset((_Optional_payload_base<cmList> *)&list);
      return bVar2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&list,"sub-command FILTER requires a mode to be specified.",
               (allocator<char> *)&local_70);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_0037a5e6:
  std::__cxx11::string::~string((string *)&list);
  return false;
}

Assistant:

bool HandleFilterCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command FILTER requires a list to be specified.");
    return false;
  }

  if (args.size() < 3) {
    status.SetError(
      "sub-command FILTER requires an operator to be specified.");
    return false;
  }

  if (args.size() < 4) {
    status.SetError("sub-command FILTER requires a mode to be specified.");
    return false;
  }

  const std::string& op = args[2];
  cmList::FilterMode filterMode;
  if (op == "INCLUDE") {
    filterMode = cmList::FilterMode::INCLUDE;
  } else if (op == "EXCLUDE") {
    filterMode = cmList::FilterMode::EXCLUDE;
  } else {
    status.SetError("sub-command FILTER does not recognize operator " + op);
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list) {
    return true;
  }

  const std::string& mode = args[3];
  if (mode != "REGEX") {
    status.SetError("sub-command FILTER does not recognize mode " + mode);
    return false;
  }
  if (args.size() != 5) {
    status.SetError("sub-command FILTER, mode REGEX "
                    "requires five arguments.");
    return false;
  }
  const std::string& pattern = args[4];

  try {
    status.GetMakefile().AddDefinition(
      listName, list->filter(pattern, filterMode).to_string());
    return true;
  } catch (std::invalid_argument& e) {
    status.SetError(e.what());
    return false;
  }
}